

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * image_format_to_type_abi_cxx11_
                   (string *__return_storage_ptr__,ImageFormat fmt,BaseType basetype)

{
  CompilerError *pCVar1;
  char *pcVar2;
  allocator local_39;
  string local_38;
  
  switch(fmt) {
  case ImageFormatUnknown:
    if (basetype == Int) goto LAB_00256b23;
    if (basetype == UInt) goto LAB_00256d6e;
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_38,"Unsupported base type for image.",&local_39)
      ;
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00256c3a;
  case ImageFormatRgba32f:
  case ImageFormatRgba16f:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_00256c3a:
    pcVar2 = "float4";
    break;
  case ImageFormatR32f:
  case ImageFormatR16f:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "float";
    break;
  case ImageFormatRgba8:
  case ImageFormatRgba16:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00256cf7;
  case ImageFormatRgba8Snorm:
  case ImageFormatRgba16Snorm:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "snorm float4";
    break;
  case ImageFormatRg32f:
  case ImageFormatRg16f:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "float2";
    break;
  case ImageFormatR11fG11fB10f:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "float3";
    break;
  case ImageFormatRgb10A2:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_00256cf7:
    pcVar2 = "unorm float4";
    break;
  case ImageFormatRg16:
  case ImageFormatRg8:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "unorm float2";
    break;
  case ImageFormatR16:
  case ImageFormatR8:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "unorm float";
    break;
  case ImageFormatRg16Snorm:
  case ImageFormatRg8Snorm:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "snorm float2";
    break;
  case ImageFormatR16Snorm:
  case ImageFormatR8Snorm:
    if (basetype != Float) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "snorm float";
    break;
  case ImageFormatRgba32i:
  case ImageFormatRgba16i:
  case ImageFormatRgba8i:
    if (basetype != Int) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_00256b23:
    pcVar2 = "int4";
    break;
  case ImageFormatR32i:
  case ImageFormatR16i:
  case ImageFormatR8i:
    if (basetype != Int) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "int";
    break;
  case ImageFormatRg32i:
  case ImageFormatRg16i:
  case ImageFormatRg8i:
    if (basetype != Int) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "int2";
    break;
  case ImageFormatRgba32ui:
  case ImageFormatRgba16ui:
  case ImageFormatRgba8ui:
    if (basetype != UInt) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00256d6e;
  case ImageFormatR32ui:
  case ImageFormatR16ui:
  case ImageFormatR8ui:
    if (basetype != UInt) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "uint";
    break;
  case ImageFormatRgb10a2ui:
    if (basetype != UInt) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_00256d6e:
    pcVar2 = "uint4";
    break;
  case ImageFormatRg32ui:
  case ImageFormatRg16ui:
  case ImageFormatRg8ui:
    if (basetype != UInt) {
      pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"Mismatch in image type and base type of image.",&local_39);
      spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
      __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = "uint2";
    break;
  default:
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"Unrecognized typed image format.",&local_39);
    spirv_cross::CompilerError::CompilerError(pCVar1,&local_38);
    __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static string image_format_to_type(ImageFormat fmt, SPIRType::BaseType basetype)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float";
	case ImageFormatRg8:
	case ImageFormatRg16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float2";
	case ImageFormatRgba8:
	case ImageFormatRgba16:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";
	case ImageFormatRgb10A2:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "unorm float4";

	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float";
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float2";
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "snorm float4";

	case ImageFormatR16f:
	case ImageFormatR32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float";
	case ImageFormatRg16f:
	case ImageFormatRg32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float2";
	case ImageFormatRgba16f:
	case ImageFormatRgba32f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float4";

	case ImageFormatR11fG11fB10f:
		if (basetype != SPIRType::Float)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "float3";

	case ImageFormatR8i:
	case ImageFormatR16i:
	case ImageFormatR32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int";
	case ImageFormatRg8i:
	case ImageFormatRg16i:
	case ImageFormatRg32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int2";
	case ImageFormatRgba8i:
	case ImageFormatRgba16i:
	case ImageFormatRgba32i:
		if (basetype != SPIRType::Int)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "int4";

	case ImageFormatR8ui:
	case ImageFormatR16ui:
	case ImageFormatR32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint";
	case ImageFormatRg8ui:
	case ImageFormatRg16ui:
	case ImageFormatRg32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint2";
	case ImageFormatRgba8ui:
	case ImageFormatRgba16ui:
	case ImageFormatRgba32ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";
	case ImageFormatRgb10a2ui:
		if (basetype != SPIRType::UInt)
			SPIRV_CROSS_THROW("Mismatch in image type and base type of image.");
		return "uint4";

	case ImageFormatUnknown:
		switch (basetype)
		{
		case SPIRType::Float:
			return "float4";
		case SPIRType::Int:
			return "int4";
		case SPIRType::UInt:
			return "uint4";
		default:
			SPIRV_CROSS_THROW("Unsupported base type for image.");
		}

	default:
		SPIRV_CROSS_THROW("Unrecognized typed image format.");
	}
}